

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.hpp
# Opt level: O0

void __thiscall Camera::Camera(Camera *this,Json *conf)

{
  bool bVar1;
  reference pvVar2;
  const_reference this_00;
  undefined8 *in_RDI;
  float fVar3;
  vec3f vVar4;
  float fov_degree;
  vector<int,_std::allocator<int>_> resolution;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffe00;
  const_reference in_stack_fffffffffffffe10;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffe80;
  vector<int,_std::allocator<int>_> local_28;
  
  *in_RDI = &PTR___cxa_pure_virtual_001e8d28;
  vec3f::vec3f((vec3f *)(in_RDI + 2));
  vec3f::vec3f((vec3f *)((long)in_RDI + 0x1c));
  vec3f::vec3f((vec3f *)(in_RDI + 5));
  *(undefined1 *)(in_RDI + 7) = 0;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator_vector<std::vector<int,_std::allocator<int>_>,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,0);
  *(value_type *)(in_RDI + 1) = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,1);
  *(value_type *)((long)in_RDI + 0xc) = *pvVar2;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  vVar4 = json2vec3f((Json *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  *(float *)(in_RDI + 3) = vVar4.z;
  in_RDI[2] = vVar4._0_8_;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  vVar4 = json2vec3f((Json *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  *(float *)((long)in_RDI + 0x24) = vVar4.z;
  *(long *)((long)in_RDI + 0x1c) = vVar4._0_8_;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  this_00 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  json2vec3f((Json *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  vVar4 = normalized((vec3f *)in_stack_fffffffffffffe10);
  *(float *)(in_RDI + 6) = vVar4.z;
  in_RDI[5] = vVar4._0_8_;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(this_00,in_stack_fffffffffffffe78);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[7]>(in_stack_fffffffffffffe18,(char (*) [7])in_stack_fffffffffffffe10);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(this_00,in_stack_fffffffffffffe78);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=(in_stack_fffffffffffffe00,
                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  if (bVar1) {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(this_00,in_stack_fffffffffffffe78);
    in_stack_fffffffffffffe10 =
         nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
         ::operator[]<char_const>(this_00,in_stack_fffffffffffffe78);
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator_bool<bool,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)0x19cac8);
    *(bool *)(in_RDI + 7) = bVar1;
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(this_00,in_stack_fffffffffffffe78);
  fVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator_float<float,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)0x19cb2a);
  *(float *)((long)in_RDI + 0x34) = (fVar3 / 180.0) * PI;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10);
  return;
}

Assistant:

Camera(const Json& conf) {
		std::vector<int> resolution = conf["resolution"];
		resx = resolution[0];
		resy = resolution[1];
		position = json2vec3f(conf["transform"]["position"]);
		look_at = json2vec3f(conf["transform"]["look_at"]);
		up = normalized(json2vec3f(conf["transform"]["up"]));
		if (conf["transform"].find("mirror") != conf["transform"].end())
			mirror = conf["transform"]["mirror"];
		float fov_degree = conf["fov"];
		fov = fov_degree / 180 * PI;
	}